

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int sort(lua_State *L)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  StkId pTVar5;
  TValue *pTVar7;
  int *piVar8;
  ulong uVar9;
  TValue *pTVar10;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  TValue *pTVar6;
  
  luaL_checktype(L,1,5);
  sVar4 = lua_objlen(L,1);
  luaL_checkstack(L,0x28,"");
  pTVar7 = L->top;
  pTVar5 = L->base;
  if ((pTVar5 + 1 != &luaO_nilobject_ && pTVar5 + 1 < pTVar7) && (0 < pTVar5[1].tt)) {
    luaL_checktype(L,2,6);
    pTVar7 = L->top;
    pTVar5 = L->base;
  }
  auVar3 = _DAT_00115030;
  auVar2 = _DAT_00115020;
  auVar1 = _DAT_00115010;
  pTVar6 = pTVar5 + 2;
  if (pTVar7 < pTVar6) {
    pTVar10 = pTVar7 + 1;
    if (pTVar7 + 1 < pTVar6) {
      pTVar10 = pTVar6;
    }
    uVar9 = (long)&pTVar10->value + ~(ulong)pTVar7;
    auVar15._8_4_ = (int)uVar9;
    auVar15._0_8_ = uVar9;
    auVar15._12_4_ = (int)(uVar9 >> 0x20);
    auVar12._0_8_ = uVar9 >> 4;
    auVar12._8_8_ = auVar15._8_8_ >> 4;
    piVar8 = &pTVar7[3].tt;
    uVar11 = 0;
    auVar12 = auVar12 ^ _DAT_00115030;
    do {
      auVar14._8_4_ = (int)uVar11;
      auVar14._0_8_ = uVar11;
      auVar14._12_4_ = (int)(uVar11 >> 0x20);
      auVar15 = (auVar14 | auVar2) ^ auVar3;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        piVar8[-0xc] = 0;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        piVar8[-8] = 0;
      }
      auVar15 = (auVar14 | auVar1) ^ auVar3;
      iVar16 = auVar15._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar15._0_4_ <= auVar12._0_4_)) {
        piVar8[-4] = 0;
        *piVar8 = 0;
      }
      uVar11 = uVar11 + 4;
      piVar8 = piVar8 + 0x10;
    } while (((uVar9 >> 4) + 4 & 0xfffffffffffffffc) != uVar11);
  }
  L->top = pTVar6;
  auxsort(L,1,(int)sVar4);
  return 0;
}

Assistant:

static int sort(lua_State*L){
int n=aux_getn(L,1);
luaL_checkstack(L,40,"");
if(!lua_isnoneornil(L,2))
luaL_checktype(L,2,6);
lua_settop(L,2);
auxsort(L,1,n);
return 0;
}